

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  printf("a = %d\nb = %d\n*pa = %d\n*pb = %d\n*pc = %d\n",6,10,10,10,10);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int a = 3;
  int b = 10;
  int c, *pa, *pb, *pc;
  pa = &a;
  *pa = *pa * 2;
  pb = &b;
  c = 3 * (*pb - *pa);
  pc = pb;
  pa = pb;
  pb = pc;

  printf("a = %d\nb = %d\n*pa = %d\n*pb = %d\n*pc = %d\n", a, b, *pa, *pb, *pc);

  return 0;
}